

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O1

void __thiscall HighsTimer::HighsTimer(HighsTimer *this)

{
  HighsInt HVar1;
  
  this->_vptr_HighsTimer = (_func_int **)&PTR__HighsTimer_00448900;
  this->initial_clock_start = 1.0;
  this->num_clock = 0;
  (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->clock_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clock_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clock_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clock_def(this,"Run HiGHS");
  HVar1 = clock_def(this,"Presolve");
  this->presolve_clock = HVar1;
  HVar1 = clock_def(this,"Solve");
  this->solve_clock = HVar1;
  HVar1 = clock_def(this,"Postsolve");
  this->postsolve_clock = HVar1;
  return;
}

Assistant:

HighsTimer() {
    num_clock = 0;
    HighsInt i_clock = clock_def("Run HiGHS");
    assert(i_clock == 0);

    presolve_clock = clock_def("Presolve");
    solve_clock = clock_def("Solve");
    postsolve_clock = clock_def("Postsolve");
  }